

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::IsFrozen
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  byte bVar1;
  bool bVar2;
  SimpleDictionaryPropertyDescriptor<int> *pSVar3;
  BOOL BVar4;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  int iVar5;
  TypedArrayBase *typedArray;
  
  bVar1 = (this->super_DynamicTypeHandler).flags;
  BVar4 = 1;
  if ((-1 < (char)bVar1) && (BVar4 = 0, (bVar1 & 1) == 0)) {
    this_00 = (this->propertyMap).ptr;
    if (0 < this_00->count - this_00->freeCount) {
      iVar5 = 0;
      do {
        pSVar3 = JsUtil::
                 BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetReferenceAt(this_00,iVar5);
        if ((pSVar3->Attributes & 6) != 0 && (pSVar3->Attributes & 0x18) == 0) {
          return 0;
        }
        iVar5 = iVar5 + 1;
        this_00 = (this->propertyMap).ptr;
      } while (iVar5 < this_00->count - this_00->freeCount);
    }
    bVar2 = DynamicObject::HasObjectArray(instance);
    if ((*(long **)&(instance->field_1).field_1 != (long *)0x0 && bVar2) &&
       (iVar5 = (**(code **)(**(long **)&(instance->field_1).field_1 + 0x370))(), iVar5 == 0)) {
      return 0;
    }
    bVar2 = DynamicObject::IsAnyTypedArray(instance);
    if ((bVar2) &&
       (iVar5 = (*(instance->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x6e])(instance),
       iVar5 == 0)) {
      return 0;
    }
    DynamicTypeHandler::SetFlags(&this->super_DynamicTypeHandler,0xc0);
    BVar4 = 1;
  }
  return BVar4;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsFrozen(DynamicObject* instance)
    {
        if (!IsNotExtensibleSupported)
        {
            return false;
        }

        BYTE flags = this->GetFlags();
        if (flags & IsFrozenOnceFlag)
        {
            // Once frozen, there is no way to undo freeze.
            // But note: still, it can also be frozen when the flag is not set.
            return true;
        }

        if (this->GetFlags() & IsExtensibleFlag)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex> *descriptor = nullptr;
        for (TPropertyIndex index = 0; index < propertyMap->Count(); index++)
        {
            descriptor = propertyMap->GetReferenceAt(index);
            if ((!(descriptor->Attributes & PropertyDeleted) && !(descriptor->Attributes & PropertyLetConstGlobal)))
            {
                // [[Configurable]] and [[Configurable]] must be false for all (existing) properties.
                // IE9 compatibility: keep IE9 behavior (also check deleted properties)
                if (descriptor->Attributes & PropertyConfigurable)
                {
                    return false;
                }

                if (descriptor->Attributes & PropertyWritable)
                {
                    return false;
                }
            }
        }

        // Use IsObjectArrayFrozen() to skip "length" [[Writable]] check
        ArrayObject * objectArray = instance->GetObjectArray();
        if (objectArray && !objectArray->IsObjectArrayFrozen())
        {
            return false;
        }

        if (DynamicObject::IsAnyTypedArray(instance))
        {
            auto typedArray = static_cast<TypedArrayBase*>(instance);
            if (!typedArray->IsObjectArrayFrozen())
            {
                return false;
            }
        }

        // Since we've determined that the object was frozen, set the flag to avoid further checks into all properties
        // (once frozen there is no way to go back to un-frozen).
        this->SetFlags(IsSealedOnceFlag | IsFrozenOnceFlag);

        return true;
    }